

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O0

uint8_t * google::protobuf::internal::ZeroFieldsBase::_InternalSerialize
                    (MessageLite *msg,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  UnknownFieldSet *unknown_fields;
  ZeroFieldsBase *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *msg_local;
  
  bVar1 = InternalMetadata::have_unknown_fields(&msg->_internal_metadata_);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    unknown_fields =
         InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&msg->_internal_metadata_,UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   WireFormat::InternalSerializeUnknownFieldsToArray(unknown_fields,target,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* ZeroFieldsBase::_InternalSerialize(const MessageLite& msg,
                                              ::uint8_t* target,
                                              io::EpsCopyOutputStream* stream) {
  auto& this_ = static_cast<const ZeroFieldsBase&>(msg);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        this_._internal_metadata_.unknown_fields<UnknownFieldSet>(
            UnknownFieldSet::default_instance),
        target, stream);
  }
  return target;
}